

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O0

iterator * __thiscall Histogram::begin(Histogram *this)

{
  HistBin *pHVar1;
  Histogram *in_RSI;
  HistItr *in_RDI;
  size_t i;
  memory_order __b;
  ulong local_28;
  
  local_28 = 0;
  while ((local_28 < 0x41 &&
         (pHVar1 = in_RSI->bins, std::operator&(memory_order_relaxed,__memory_order_mask),
         pHVar1[local_28].super___atomic_base<unsigned_long>._M_i == 0))) {
    local_28 = local_28 + 1;
  }
  HistItr::HistItr(in_RDI,local_28,0x41,in_RSI);
  return in_RDI;
}

Assistant:

iterator begin() const {
        size_t i;
        for (i=0; i<MAX_BINS; ++i) {
            if (bins[i].load(std::memory_order_relaxed)) break;
        }
        return HistItr(i, MAX_BINS, this);
    }